

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O0

int nni_plat_udp_open(nni_plat_udp **upp,nni_sockaddr *bindaddr)

{
  int iVar1;
  size_t sVar2;
  nni_plat_udp *pfd;
  int *piVar3;
  undefined1 local_b0 [4];
  int rv;
  sockaddr_storage sa;
  int salen;
  nni_plat_udp *udp;
  nni_sockaddr *bindaddr_local;
  nni_plat_udp **upp_local;
  
  if (bindaddr == (nni_sockaddr *)0x0) {
    upp_local._4_4_ = 0xf;
  }
  else if (bindaddr->s_family == 3 || bindaddr->s_family == 4) {
    sVar2 = nni_posix_nn2sockaddr(local_b0,bindaddr);
    sa.__ss_align._4_4_ = (socklen_t)sVar2;
    if ((int)sa.__ss_align._4_4_ < 2) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_udp.c"
                ,0x14b,"salen > 1");
    }
    pfd = (nni_plat_udp *)nni_zalloc(0x98);
    if (pfd == (nni_plat_udp *)0x0) {
      upp_local._4_4_ = 2;
    }
    else {
      nni_mtx_init(&pfd->udp_mtx);
      nni_aio_list_init(&pfd->udp_recvq);
      nni_aio_list_init(&pfd->udp_sendq);
      iVar1 = socket((uint)(ushort)local_b0._0_2_,2,0x11);
      pfd->udp_fd = iVar1;
      if (pfd->udp_fd < 0) {
        piVar3 = __errno_location();
        upp_local._4_4_ = nni_plat_errno(*piVar3);
        nni_mtx_fini(&pfd->udp_mtx);
        nni_free(pfd,0x98);
      }
      else {
        iVar1 = bind(pfd->udp_fd,(sockaddr *)local_b0,sa.__ss_align._4_4_);
        if (iVar1 == 0) {
          nni_posix_pfd_init((nni_posix_pfd *)pfd,pfd->udp_fd,nni_posix_udp_cb,pfd);
          *upp = pfd;
          upp_local._4_4_ = 0;
        }
        else {
          piVar3 = __errno_location();
          upp_local._4_4_ = nni_plat_errno(*piVar3);
          close(pfd->udp_fd);
          nni_mtx_fini(&pfd->udp_mtx);
          nni_free(pfd,0x98);
        }
      }
    }
  }
  else {
    upp_local._4_4_ = 0xf;
  }
  return upp_local._4_4_;
}

Assistant:

int
nni_plat_udp_open(nni_plat_udp **upp, nni_sockaddr *bindaddr)
{
	nni_plat_udp           *udp;
	int                     salen;
	struct sockaddr_storage sa;
	int                     rv;

	if (bindaddr == NULL) {
		return (NNG_EADDRINVAL);
	}
	switch (bindaddr->s_family) {
	case NNG_AF_INET:
#ifdef NNG_ENABLE_IPV6
	case NNG_AF_INET6:
#endif
		break;
	default:
		return (NNG_EADDRINVAL);
	}
	salen = nni_posix_nn2sockaddr(&sa, bindaddr);
	NNI_ASSERT(salen > 1);

	// UDP opens can actually run synchronously.
	if ((udp = NNI_ALLOC_STRUCT(udp)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&udp->udp_mtx);
	nni_aio_list_init(&udp->udp_recvq);
	nni_aio_list_init(&udp->udp_sendq);

	udp->udp_fd = socket(sa.ss_family, SOCK_DGRAM, IPPROTO_UDP);
	if (udp->udp_fd < 0) {
		rv = nni_plat_errno(errno);
		nni_mtx_fini(&udp->udp_mtx);
		NNI_FREE_STRUCT(udp);
		return (rv);
	}

	if (bind(udp->udp_fd, (void *) &sa, salen) != 0) {
		rv = nni_plat_errno(errno);
		(void) close(udp->udp_fd);
		nni_mtx_fini(&udp->udp_mtx);
		NNI_FREE_STRUCT(udp);
		return (rv);
	}

	nni_posix_pfd_init(&udp->udp_pfd, udp->udp_fd, nni_posix_udp_cb, udp);

	*upp = udp;
	return (0);
}